

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderTextEllipsis
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,float clip_max_x,
               float ellipsis_max_x,char *text,char *text_end_full,ImVec2 *text_size_if_known)

{
  float size;
  ImFont *this;
  undefined4 uVar1;
  undefined4 uVar2;
  char *text_end;
  ImVec2 *pIVar3;
  ImDrawList *draw_list_00;
  char *in_text;
  int iVar4;
  ImU32 col;
  ImFontGlyph *pIVar5;
  int iVar6;
  ImGuiContext_conflict1 *g;
  ImGuiContext_conflict1 *pIVar7;
  char *text_display_end;
  uint uVar8;
  ImVec2 IVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  float fVar12;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  ImWchar local_c2;
  float local_c0;
  char *text_end_ellipsis;
  float local_b0;
  float local_ac;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  ImVec4 local_98;
  ImVec2 *local_80;
  char *local_78;
  ImVec2 local_70;
  undefined1 local_68 [16];
  ImVec2 *local_50;
  ImGuiContext_conflict1 *local_48;
  ImDrawList *local_40;
  ImVec2 local_38;
  undefined8 extraout_XMM0_Qb;
  
  pIVar7 = GImGui;
  local_68._4_4_ = in_XMM1_Db;
  local_68._0_4_ = ellipsis_max_x;
  local_68._8_4_ = in_XMM1_Dc;
  local_68._12_4_ = in_XMM1_Dd;
  if (text_end_full == (char *)0x0) {
    text_end_full = text;
    if (text != (char *)0xffffffffffffffff) {
      do {
        if (*text_end_full == '#') {
          if (text_end_full[1] == '#') goto LAB_001bfae7;
        }
        else if (*text_end_full == '\0') goto LAB_001bfae7;
        text_end_full = text_end_full + 1;
      } while (text_end_full != (char *)0xffffffffffffffff);
    }
    text_end_full = (char *)0xffffffffffffffff;
  }
LAB_001bfae7:
  local_b0 = clip_max_x;
  if (text_size_if_known == (ImVec2 *)0x0) {
    if (text_end_full == text) {
      local_70 = (ImVec2)((ulong)(uint)GImGui->FontSize << 0x20);
    }
    else {
      auVar10._0_8_ =
           ImFont::CalcTextSizeA
                     (GImGui->Font,GImGui->FontSize,3.4028235e+38,0.0,text,text_end_full,
                      (char **)0x0);
      auVar10._8_8_ = extraout_XMM0_Qb;
      auVar11._4_12_ = auVar10._4_12_;
      auVar11._0_4_ = (float)(int)(auVar10._0_4_ + 0.99999);
      local_70 = auVar11._0_8_;
    }
  }
  else {
    local_70 = *text_size_if_known;
  }
  if (local_70.x <= pos_max->x - pos_min->x) {
    local_98.y = pos_max->y;
    local_98.x = local_b0;
    text_end_ellipsis = (char *)0x0;
    RenderTextClippedEx(draw_list,pos_min,(ImVec2 *)&local_98,text,text_end_full,&local_70,
                        (ImVec2 *)&text_end_ellipsis,(ImRect *)0x0);
  }
  else {
    this = draw_list->_Data->Font;
    size = draw_list->_Data->FontSize;
    text_end_ellipsis = (char *)0x0;
    local_c2 = this->EllipsisChar;
    local_48 = pIVar7;
    local_80 = pos_max;
    local_78 = text;
    local_40 = draw_list;
    if (local_c2 == 0xffff) {
      local_c2 = this->DotChar;
      pIVar5 = ImFont::FindGlyph(this,local_c2);
      local_ac = draw_list->_Data->FontSize / this->FontSize;
      local_c0 = (pIVar5->X1 - pIVar5->X0) + local_ac;
      local_ac = local_c0 * 3.0 - local_ac;
      iVar6 = 3;
    }
    else {
      pIVar5 = ImFont::FindGlyph(this,local_c2);
      local_ac = pIVar5->X1;
      iVar6 = 1;
      local_c0 = local_ac;
    }
    in_text = local_78;
    uVar8 = -(uint)((float)local_68._0_4_ <= local_80->x);
    fVar12 = ((float)(~uVar8 & local_68._0_4_ | (uint)local_80->x & uVar8) - local_ac) - pos_min->x;
    if (fVar12 <= 1.0) {
      fVar12 = 1.0;
    }
    local_50 = pos_min;
    local_a8 = ImFont::CalcTextSizeA(this,size,fVar12,0.0,local_78,text_end_full,&text_end_ellipsis)
    ;
    uStack_a0 = extraout_XMM0_Qb_00;
    text_end = text_end_ellipsis;
    pIVar3 = local_50;
    draw_list_00 = local_40;
    if (text_end_ellipsis < text_end_full && text_end_ellipsis == in_text) {
      iVar4 = ImTextCharFromUtf8((uint *)&local_98,in_text,text_end_full);
      text_end_ellipsis = in_text + iVar4;
      local_a8 = ImFont::CalcTextSizeA
                           (this,size,3.4028235e+38,0.0,in_text,text_end_ellipsis,(char **)0x0);
      uStack_a0 = extraout_XMM0_Qb_01;
      text_end = text_end_ellipsis;
      pIVar3 = local_50;
      draw_list_00 = local_40;
    }
    while ((pos_min = local_50, local_50 = pIVar3, local_40 = draw_list_00, in_text < text_end &&
           ((text_end[-1] == ' ' || (text_end[-1] == '\t'))))) {
      text_end_ellipsis = text_end + -1;
      IVar9 = ImFont::CalcTextSizeA
                        (this,size,3.4028235e+38,0.0,text_end_ellipsis,text_end,(char **)0x0);
      local_a8.x = local_a8.x - IVar9.x;
      text_end = text_end_ellipsis;
      pIVar3 = local_50;
      draw_list_00 = local_40;
      local_50 = pos_min;
    }
    local_98.y = local_80->y;
    local_98.x = local_b0;
    local_38.x = 0.0;
    local_38.y = 0.0;
    text_end_ellipsis = text_end;
    RenderTextClippedEx(draw_list_00,pos_min,(ImVec2 *)&local_98,in_text,text_end,&local_70,
                        &local_38,(ImRect *)0x0);
    fVar12 = local_a8.x + pos_min->x;
    text = local_78;
    pIVar7 = local_48;
    if (local_ac + fVar12 <= (float)local_68._0_4_) {
      do {
        local_a8.x = fVar12;
        local_68 = ZEXT416((uint)pos_min->y);
        local_98.x = (GImGui->Style).Colors[0].x;
        local_98.y = (GImGui->Style).Colors[0].y;
        uVar1 = (GImGui->Style).Colors[0].z;
        uVar2 = (GImGui->Style).Colors[0].w;
        local_98.w = (GImGui->Style).Alpha * (float)uVar2;
        local_98.z = (float)uVar1;
        col = ColorConvertFloat4ToU32(&local_98);
        IVar9.y = (float)local_68._0_4_;
        IVar9.x = local_a8.x;
        ImFont::RenderChar(this,draw_list_00,size,IVar9,col,local_c2);
        fVar12 = local_a8.x + local_c0;
        iVar6 = iVar6 + -1;
        text = local_78;
        pIVar7 = local_48;
      } while (iVar6 != 0);
    }
  }
  if (pIVar7->LogEnabled == true) {
    LogRenderedText(pos_min,text,text_end_full);
  }
  return;
}

Assistant:

void ImGui::RenderTextEllipsis(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, float clip_max_x, float ellipsis_max_x, const char* text, const char* text_end_full, const ImVec2* text_size_if_known)
{
    ImGuiContext& g = *GImGui;
    if (text_end_full == NULL)
        text_end_full = FindRenderedTextEnd(text);
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_end_full, false, 0.0f);

    //draw_list->AddLine(ImVec2(pos_max.x, pos_min.y - 4), ImVec2(pos_max.x, pos_max.y + 4), IM_COL32(0, 0, 255, 255));
    //draw_list->AddLine(ImVec2(ellipsis_max_x, pos_min.y-2), ImVec2(ellipsis_max_x, pos_max.y+2), IM_COL32(0, 255, 0, 255));
    //draw_list->AddLine(ImVec2(clip_max_x, pos_min.y), ImVec2(clip_max_x, pos_max.y), IM_COL32(255, 0, 0, 255));
    // FIXME: We could technically remove (last_glyph->AdvanceX - last_glyph->X1) from text_size.x here and save a few pixels.
    if (text_size.x > pos_max.x - pos_min.x)
    {
        // Hello wo...
        // |       |   |
        // min   max   ellipsis_max
        //          <-> this is generally some padding value

        const ImFont* font = draw_list->_Data->Font;
        const float font_size = draw_list->_Data->FontSize;
        const char* text_end_ellipsis = NULL;

        ImWchar ellipsis_char = font->EllipsisChar;
        int ellipsis_char_count = 1;
        if (ellipsis_char == (ImWchar)-1)
        {
            ellipsis_char = font->DotChar;
            ellipsis_char_count = 3;
        }
        const ImFontGlyph* glyph = font->FindGlyph(ellipsis_char);

        float ellipsis_glyph_width = glyph->X1;                 // Width of the glyph with no padding on either side
        float ellipsis_total_width = ellipsis_glyph_width;      // Full width of entire ellipsis

        if (ellipsis_char_count > 1)
        {
            // Full ellipsis size without free spacing after it.
            const float spacing_between_dots = 1.0f * (draw_list->_Data->FontSize / font->FontSize);
            ellipsis_glyph_width = glyph->X1 - glyph->X0 + spacing_between_dots;
            ellipsis_total_width = ellipsis_glyph_width * (float)ellipsis_char_count - spacing_between_dots;
        }

        // We can now claim the space between pos_max.x and ellipsis_max.x
        const float text_avail_width = ImMax((ImMax(pos_max.x, ellipsis_max_x) - ellipsis_total_width) - pos_min.x, 1.0f);
        float text_size_clipped_x = font->CalcTextSizeA(font_size, text_avail_width, 0.0f, text, text_end_full, &text_end_ellipsis).x;
        if (text == text_end_ellipsis && text_end_ellipsis < text_end_full)
        {
            // Always display at least 1 character if there's no room for character + ellipsis
            text_end_ellipsis = text + ImTextCountUtf8BytesFromChar(text, text_end_full);
            text_size_clipped_x = font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text, text_end_ellipsis).x;
        }
        while (text_end_ellipsis > text && ImCharIsBlankA(text_end_ellipsis[-1]))
        {
            // Trim trailing space before ellipsis (FIXME: Supporting non-ascii blanks would be nice, for this we need a function to backtrack in UTF-8 text)
            text_end_ellipsis--;
            text_size_clipped_x -= font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text_end_ellipsis, text_end_ellipsis + 1).x; // Ascii blanks are always 1 byte
        }

        // Render text, render ellipsis
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_ellipsis, &text_size, ImVec2(0.0f, 0.0f));
        float ellipsis_x = pos_min.x + text_size_clipped_x;
        if (ellipsis_x + ellipsis_total_width <= ellipsis_max_x)
            for (int i = 0; i < ellipsis_char_count; i++)
            {
                font->RenderChar(draw_list, font_size, ImVec2(ellipsis_x, pos_min.y), GetColorU32(ImGuiCol_Text), ellipsis_char);
                ellipsis_x += ellipsis_glyph_width;
            }
    }
    else
    {
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_full, &text_size, ImVec2(0.0f, 0.0f));
    }

    if (g.LogEnabled)
        LogRenderedText(&pos_min, text, text_end_full);
}